

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void add_damage(xchar x,xchar y,long cost)

{
  level *plVar1;
  char *pcVar2;
  monst *pmVar3;
  damage *pdVar4;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  undefined7 in_register_00000039;
  
  iVar5 = (int)CONCAT71(in_register_00000031,y);
  iVar6 = (int)CONCAT71(in_register_00000039,x);
  if (level->locations[iVar6][iVar5].typ == '\x17') {
    for (pcVar2 = in_rooms(level,x,y,0x12); *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
      pmVar3 = shop_keeper(level,*pcVar2);
      if (((pmVar3 != (monst *)0x0) && ((char)pmVar3[0x1b].mintrinsics == x)) &&
         (*(char *)((long)&pmVar3[0x1b].mintrinsics + 1) == y)) {
        if (*pcVar2 == '\0') {
          return;
        }
        goto LAB_00230100;
      }
    }
  }
  else {
LAB_00230100:
    plVar1 = level;
    pdVar4 = (damage *)&level->damagelist;
    do {
      pdVar4 = pdVar4->next;
      if (pdVar4 == (damage *)0x0) {
        pdVar4 = (damage *)malloc(0x20);
        pdVar4->when = (ulong)moves;
        (pdVar4->place).x = x;
        (pdVar4->place).y = y;
        pdVar4->cost = cost;
        pdVar4->typ = plVar1->locations[iVar6][iVar5].typ;
        pdVar4->next = plVar1->damagelist;
        plVar1->damagelist = pdVar4;
        if ((viz_array[iVar5][iVar6] & 2U) == 0) {
          return;
        }
        plVar1->locations[iVar6][iVar5].seenv = 0xff;
        return;
      }
    } while (((pdVar4->place).x != x) || ((pdVar4->place).y != y));
    pdVar4->cost = pdVar4->cost + cost;
  }
  return;
}

Assistant:

void add_damage(xchar x, xchar y, long cost)
{
	struct damage *tmp_dam;
	char *shops;

	if (IS_DOOR(level->locations[x][y].typ)) {
	    struct monst *mtmp;

	    /* Don't schedule for repair unless it's a real shop entrance */
	    for (shops = in_rooms(level, x, y, SHOPBASE); *shops; shops++)
		if ((mtmp = shop_keeper(level, *shops)) != 0 &&
			x == ESHK(mtmp)->shd.x && y == ESHK(mtmp)->shd.y)
		    break;
	    if (!*shops) return;
	}
	for (tmp_dam = level->damagelist; tmp_dam; tmp_dam = tmp_dam->next)
	    if (tmp_dam->place.x == x && tmp_dam->place.y == y) {
		tmp_dam->cost += cost;
		return;
	    }
	tmp_dam = malloc((unsigned)sizeof(struct damage));
	tmp_dam->when = moves;
	tmp_dam->place.x = x;
	tmp_dam->place.y = y;
	tmp_dam->cost = cost;
	tmp_dam->typ = level->locations[x][y].typ;
	tmp_dam->next = level->damagelist;
	level->damagelist = tmp_dam;
	/* If player saw damage, display as a wall forever */
	if (cansee(x, y))
	    level->locations[x][y].seenv = SVALL;
}